

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void hta::
     throw_exception<hta::Exception,char_const*,std::chrono::duration<long,std::ratio<1l,1000000000l>>,char_const*,long>
               (char *args,duration<long,_std::ratio<1L,_1000000000L>_> args_1,char *args_2,
               long args_3)

{
  Exception *this;
  string local_1f0;
  rep local_1c0;
  make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_const_char_*,_long>
  local_1b1;
  stringstream local_1b0 [8];
  stringstream msg;
  long args_local_3;
  char *args_local_2;
  char *args_local;
  duration<long,_std::ratio<1L,_1000000000L>_> args_local_1;
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_1c0 = args_1.__r;
  detail::
  make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_const_char_*,_long>
  ::operator()(&local_1b1,(stringstream *)local_1b0,args,args_1,args_2,args_3);
  this = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  Exception::Exception(this,&local_1f0);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}